

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall
CMU462::Application::dragSelection
          (Application *this,float x,float y,float dx,float dy,Matrix4x4 *modelViewProj)

{
  SceneObject *pSVar1;
  HalfedgeElement *pHVar2;
  undefined8 in_RDX;
  float fVar3;
  float fVar4;
  
  pSVar1 = (this->scene->selected).object;
  if (pSVar1 == (SceneObject *)0x0) {
    return;
  }
  fVar3 = (float)((double)dx *
                 (2.0 / (((double)CONCAT44(0x45300000,(int)(this->screenW >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->screenW) - 4503599627370496.0))));
  fVar4 = (float)((double)dy *
                 (-2.0 / (((double)CONCAT44(0x45300000,(int)(this->screenH >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)this->screenH) - 4503599627370496.0))));
  pHVar2 = (this->scene->selected).element;
  if (pHVar2 != (HalfedgeElement *)0x0) {
    (*pHVar2->_vptr_HalfedgeElement[4])
              ((double)fVar3,(double)fVar4,pHVar2,modelViewProj,in_RDX,
               pHVar2->_vptr_HalfedgeElement[4]);
    return;
  }
  (*pSVar1->_vptr_SceneObject[6])((double)x,(double)y,(double)fVar3,(double)fVar4);
  return;
}

Assistant:

void Application::dragSelection(float x, float y, float dx, float dy,
                                const Matrix4x4 &modelViewProj) {
  if (scene->selected.object == nullptr) return;

  dx *= 2. / screenW;
  dy *= -2. / screenH;

  if (scene->selected.element) {
    scene->selected.element->translate(dx, dy, modelViewProj);
  } else {
    scene->selected.object->drag(x, y, dx, dy, modelViewProj);
  }
}